

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.h
# Opt level: O0

Complex libDAI::KL_dist<double>(TFactor<double> *P,TFactor<double> *Q)

{
  undefined1 auVar1 [16];
  bool bVar2;
  undefined8 extraout_RAX;
  undefined8 extraout_RDX;
  Complex CVar3;
  TProb<double> *in_stack_00000048;
  TProb<double> *in_stack_00000050;
  complex<double> local_10;
  
  bVar2 = VarSet::empty((VarSet *)0xb23338);
  if ((!bVar2) && (bVar2 = VarSet::empty((VarSet *)0xb23346), !bVar2)) {
    CVar3 = KL_dist(in_stack_00000050,in_stack_00000048);
    return (Complex)CVar3._M_value;
  }
  std::complex<double>::complex(&local_10,-1.0,0.0);
  auVar1._8_8_ = extraout_RDX;
  auVar1._0_8_ = extraout_RAX;
  return (Complex)(_ComplexT)auVar1;
}

Assistant:

Complex KL_dist(const TFactor<T> & P, const TFactor<T> & Q) {
        if( P._vs.empty() || Q._vs.empty() )
            return -1;
        else {
#ifdef DEBUG
            assert( P._vs == Q._vs );
#endif
            return KL_dist( P._p, Q._p );
        }
    }